

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O0

void benchmark::ToExponentAndMantissa
               (double val,double thresh,int precision,double one_k,string *mantissa,
               int64_t *exponent)

{
  double *pdVar1;
  __type_conflict _Var2;
  string local_278 [32];
  string local_258 [32];
  ulong local_238;
  size_t i_1;
  double scaled_1;
  string local_220 [32];
  ulong local_200;
  size_t i;
  double scaled;
  double small_threshold;
  double big_threshold;
  double local_1d8;
  double adjusted_threshold;
  stringstream local_1c0 [8];
  stringstream mantissa_stream;
  ostream local_1b0 [376];
  ulong *local_38;
  int64_t *exponent_local;
  string *mantissa_local;
  double one_k_local;
  double dStack_18;
  int precision_local;
  double thresh_local;
  double val_local;
  
  local_38 = (ulong *)exponent;
  exponent_local = (int64_t *)mantissa;
  mantissa_local = (string *)one_k;
  one_k_local._4_4_ = precision;
  dStack_18 = thresh;
  thresh_local = val;
  std::__cxx11::stringstream::stringstream(local_1c0);
  if (thresh_local < 0.0) {
    std::operator<<(local_1b0,"-");
    thresh_local = -thresh_local;
  }
  _Var2 = std::pow<double,int>(10.0,one_k_local._4_4_);
  big_threshold = 1.0 / _Var2;
  pdVar1 = std::max<double>(&stack0xffffffffffffffe8,&big_threshold);
  scaled = *pdVar1;
  small_threshold = scaled * (double)mantissa_local;
  local_1d8 = scaled;
  if (thresh_local <= small_threshold) {
    if (scaled <= thresh_local) {
      std::ostream::operator<<(local_1b0,thresh_local);
      *local_38 = 0;
    }
    else {
      i_1 = (size_t)thresh_local;
      for (local_238 = 0; local_238 < 9; local_238 = local_238 + 1) {
        i_1 = (size_t)((double)mantissa_local * (double)i_1);
        if (scaled <= (double)i_1) {
          std::ostream::operator<<(local_1b0,(double)i_1);
          *local_38 = ~local_238;
          std::__cxx11::stringstream::str();
          std::__cxx11::string::operator=((string *)exponent_local,local_258);
          std::__cxx11::string::~string(local_258);
          scaled_1._4_4_ = 1;
          goto LAB_00120b97;
        }
      }
      std::ostream::operator<<(local_1b0,thresh_local);
      *local_38 = 0;
    }
  }
  else {
    i = (size_t)thresh_local;
    for (local_200 = 0; local_200 < 9; local_200 = local_200 + 1) {
      i = (size_t)((double)i / (double)mantissa_local);
      if ((double)i <= small_threshold) {
        std::ostream::operator<<(local_1b0,(double)i);
        *local_38 = local_200 + 1;
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator=((string *)exponent_local,local_220);
        std::__cxx11::string::~string(local_220);
        scaled_1._4_4_ = 1;
        goto LAB_00120b97;
      }
    }
    std::ostream::operator<<(local_1b0,thresh_local);
    *local_38 = 0;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)exponent_local,local_278);
  std::__cxx11::string::~string(local_278);
  scaled_1._4_4_ = 0;
LAB_00120b97:
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

void ToExponentAndMantissa(double val, double thresh, int precision,
                           double one_k, std::string* mantissa,
                           int64_t* exponent) {
  std::stringstream mantissa_stream;

  if (val < 0) {
    mantissa_stream << "-";
    val = -val;
  }

  // Adjust threshold so that it never excludes things which can't be rendered
  // in 'precision' digits.
  const double adjusted_threshold =
      std::max(thresh, 1.0 / std::pow(10.0, precision));
  const double big_threshold = adjusted_threshold * one_k;
  const double small_threshold = adjusted_threshold;

  if (val > big_threshold) {
    // Positive powers
    double scaled = val;
    for (size_t i = 0; i < arraysize(kBigSIUnits); ++i) {
      scaled /= one_k;
      if (scaled <= big_threshold) {
        mantissa_stream << scaled;
        *exponent = i + 1;
        *mantissa = mantissa_stream.str();
        return;
      }
    }
    mantissa_stream << val;
    *exponent = 0;
  } else if (val < small_threshold) {
    // Negative powers
    double scaled = val;
    for (size_t i = 0; i < arraysize(kSmallSIUnits); ++i) {
      scaled *= one_k;
      if (scaled >= small_threshold) {
        mantissa_stream << scaled;
        *exponent = -static_cast<int64_t>(i + 1);
        *mantissa = mantissa_stream.str();
        return;
      }
    }
    mantissa_stream << val;
    *exponent = 0;
  } else {
    mantissa_stream << val;
    *exponent = 0;
  }
  *mantissa = mantissa_stream.str();
}